

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamio.c
# Opt level: O0

void prvTidyoutBOM(StreamOut *out)

{
  StreamOut *out_local;
  
  if ((((out->encoding == 4) || (out->encoding == 9)) || (out->encoding == 10)) ||
     (out->encoding == 0xb)) {
    prvTidyWriteChar(0xfeff,out);
  }
  return;
}

Assistant:

void TY_(outBOM)( StreamOut *out )
{
    if ( out->encoding == UTF8
         || out->encoding == UTF16LE
         || out->encoding == UTF16BE
         || out->encoding == UTF16
       )
    {
        /* this will take care of encoding the BOM correctly */
        TY_(WriteChar)( UNICODE_BOM, out );
    }
}